

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O1

void write_unsigned_impl<unsigned_int>
               (raw_ostream *S,uint N,size_t MinDigits,IntegerStyle Style,bool IsNegative)

{
  char *pcVar1;
  bool bVar2;
  byte *pbVar3;
  char *pcVar4;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  long lVar5;
  void *__buf_00;
  size_t I;
  void *pvVar6;
  ArrayRef<char> Buffer;
  char NumberBuffer [128];
  char acStack_40 [16];
  
  builtin_strncpy(acStack_40,"00000000",8);
  pbVar3 = (byte *)(acStack_40 + 7);
  lVar5 = 0;
  pcVar4 = (char *)0xcccccccd;
  __buf = (void *)0x100000000;
  do {
    lVar5 = lVar5 + 0x100000000;
    *pbVar3 = (char)N + (char)(N / 10) * -10 | 0x30;
    pbVar3 = pbVar3 + -1;
    bVar2 = 9 < N;
    N = N / 10;
  } while (bVar2);
  __buf_00 = (void *)(lVar5 >> 0x20);
  if (IsNegative) {
    pcVar1 = S->OutBufCur;
    if (pcVar1 < S->OutBufEnd) {
      pcVar4 = pcVar1 + 1;
      S->OutBufCur = pcVar4;
      *pcVar1 = '-';
    }
    else {
      llvm::raw_ostream::write(S,0x2d,(void *)0x100000000,0xcccccccd);
      __buf = extraout_RDX;
    }
  }
  pcVar4 = (char *)CONCAT71((int7)((ulong)pcVar4 >> 8),Style == Number || MinDigits <= __buf_00);
  pvVar6 = __buf_00;
  if (Style != Number && MinDigits > __buf_00) {
    do {
      pcVar1 = S->OutBufCur;
      if (pcVar1 < S->OutBufEnd) {
        pcVar4 = pcVar1 + 1;
        S->OutBufCur = pcVar4;
        *pcVar1 = '0';
      }
      else {
        llvm::raw_ostream::write(S,0x30,__buf,(size_t)pcVar4);
        __buf = extraout_RDX_00;
      }
      pvVar6 = (void *)((long)pvVar6 + 1);
    } while (pvVar6 < MinDigits);
  }
  if (Style == Number) {
    Buffer.Length = (size_type)__buf_00;
    Buffer.Data = acStack_40 + (8 - (long)__buf_00);
    writeWithCommas(S,Buffer);
  }
  else {
    llvm::raw_ostream::write(S,(int)(acStack_40 + (8 - (long)__buf_00)),__buf_00,(size_t)pcVar4);
  }
  return;
}

Assistant:

static void write_unsigned_impl(raw_ostream &S, T N, size_t MinDigits,
                                IntegerStyle Style, bool IsNegative) {
  static_assert(std::is_unsigned<T>::value, "Value is not unsigned!");

  char NumberBuffer[128];
  std::memset(NumberBuffer, '0', sizeof(NumberBuffer));

  size_t Len = 0;
  Len = format_to_buffer(N, NumberBuffer);

  if (IsNegative)
    S << '-';

  if (Len < MinDigits && Style != IntegerStyle::Number) {
    for (size_t I = Len; I < MinDigits; ++I)
      S << '0';
  }

  if (Style == IntegerStyle::Number) {
    writeWithCommas(S, ArrayRef<char>(std::end(NumberBuffer) - Len, Len));
  } else {
    S.write(std::end(NumberBuffer) - Len, Len);
  }
}